

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void google::protobuf::internal::MapFieldPrinterHelper::CopyValue
               (MapValueRef *value,Message *message,FieldDescriptor *field_desc)

{
  pointer pcVar1;
  bool value_00;
  int32 value_01;
  int iVar2;
  uint32 value_02;
  Message *pMVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  uint64 value_03;
  int64 value_04;
  string *psVar5;
  Reflection *this;
  float value_05;
  double value_06;
  string local_58;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (*(once_flag **)(field_desc + 0x30) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field_desc;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field_desc + 0x30),&local_30,&local_38);
  }
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_desc + 0x38) * 4)) {
  case 1:
    value_01 = MapValueRef::GetInt32Value(value);
    Reflection::SetInt32(this,message,field_desc,value_01);
    break;
  case 2:
    value_04 = MapValueRef::GetInt64Value(value);
    Reflection::SetInt64(this,message,field_desc,value_04);
    break;
  case 3:
    value_02 = MapValueRef::GetUInt32Value(value);
    Reflection::SetUInt32(this,message,field_desc,value_02);
    break;
  case 4:
    value_03 = MapValueRef::GetUInt64Value(value);
    Reflection::SetUInt64(this,message,field_desc,value_03);
    break;
  case 5:
    value_06 = MapValueRef::GetDoubleValue(value);
    Reflection::SetDouble(this,message,field_desc,value_06);
    break;
  case 6:
    value_05 = MapValueRef::GetFloatValue(value);
    Reflection::SetFloat(this,message,field_desc,value_05);
    break;
  case 7:
    value_00 = MapValueRef::GetBoolValue(value);
    Reflection::SetBool(this,message,field_desc,value_00);
    break;
  case 8:
    iVar2 = MapValueRef::GetEnumValue(value);
    Reflection::SetEnumValue(this,message,field_desc,iVar2);
    break;
  case 9:
    psVar5 = MapValueRef::GetStringValue_abi_cxx11_(value);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + psVar5->_M_string_length);
    Reflection::SetString(this,message,field_desc,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    break;
  case 10:
    pMVar3 = MapValueRef::GetMessageValue(value);
    iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
    pMVar3 = (Message *)CONCAT44(extraout_var,iVar2);
    pMVar4 = MapValueRef::GetMessageValue(value);
    (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x10])(pMVar3,pMVar4);
    Reflection::SetAllocatedMessage(this,message,pMVar3,field_desc);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyValue(const MapValueRef& value,
                                      Message* message,
                                      const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
      reflection->SetDouble(message, field_desc, value.GetDoubleValue());
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      reflection->SetFloat(message, field_desc, value.GetFloatValue());
      return;
    case FieldDescriptor::CPPTYPE_ENUM:
      reflection->SetEnumValue(message, field_desc, value.GetEnumValue());
      return;
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      Message* sub_message = value.GetMessageValue().New();
      sub_message->CopyFrom(value.GetMessageValue());
      reflection->SetAllocatedMessage(message, sub_message, field_desc);
      return;
    }
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, value.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, value.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, value.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, value.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, value.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, value.GetBoolValue());
      return;
  }
}